

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::add_listener_all
          (task_impl_base<_1a67ba37_> *this,shared_ptr<transwarp::listener> *listener)

{
  shared_ptr<transwarp::listener> local_38;
  undefined1 local_28 [8];
  add_listener_visitor visitor;
  shared_ptr<transwarp::listener> *listener_local;
  task_impl_base<_1a67ba37_> *this_local;
  
  visitor.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)listener;
  ensure_task_not_running(this);
  std::shared_ptr<transwarp::listener>::shared_ptr(&local_38,listener);
  add_listener_visitor::add_listener_visitor((add_listener_visitor *)local_28,&local_38);
  std::shared_ptr<transwarp::listener>::~shared_ptr(&local_38);
  visit_depth_all<transwarp::detail::add_listener_visitor>(this,(add_listener_visitor *)local_28);
  add_listener_visitor::~add_listener_visitor((add_listener_visitor *)local_28);
  return;
}

Assistant:

void add_listener_all(std::shared_ptr<transwarp::listener> listener) override {
        ensure_task_not_running();
        transwarp::detail::add_listener_visitor visitor(std::move(listener));
        visit_depth_all(visitor);
    }